

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O0

QPoint QHighDpi::fromNativePixels<QPoint,QScreen>(QPoint *value,QScreen *context)

{
  long lVar1;
  undefined1 auVar2 [12];
  QPoint QVar3;
  QPoint *in_RSI;
  long in_FS_OFFSET;
  ScaleAndOrigin so;
  QPoint *in_stack_ffffffffffffffa0;
  QPoint *pos;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = in_RSI;
  QPoint::QPoint(in_stack_ffffffffffffffa0);
  QVar3 = (QPoint)((ulong)uStack_20 << 0x20);
  auVar2._4_4_ = local_1c;
  auVar2._0_4_ = uStack_20;
  auVar2._8_4_ = 0;
  QHighDpiScaling::scaleAndOrigin((QScreen *)in_RSI,(Point)(auVar2 << 0x20));
  QVar3 = scale(pos,(qreal)in_stack_ffffffffffffffa0,QVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}